

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Write<float>(Builder *this,float val,size_t byte_width)

{
  size_t byte_width_local;
  Builder *pBStack_10;
  float val_local;
  Builder *this_local;
  
  byte_width_local._4_4_ = val;
  pBStack_10 = this;
  if (byte_width < 5) {
    byte_width_local._4_4_ = flatbuffers::EndianScalar<float>(val);
    WriteBytes(this,(void *)((long)&byte_width_local + 4),byte_width);
    return;
  }
  __assert_fail("sizeof(T) >= byte_width",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5a3,"void flexbuffers::Builder::Write(T, size_t) [T = float]");
}

Assistant:

void Write(T val, size_t byte_width) {
    FLATBUFFERS_ASSERT(sizeof(T) >= byte_width);
    val = flatbuffers::EndianScalar(val);
    WriteBytes(&val, byte_width);
  }